

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::analyze_argument_buffers(CompilerMSL *this)

{
  map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
  *this_00;
  unordered_set<spirv_cross::SetBindingPair,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::SetBindingPair>,_std::allocator<spirv_cross::SetBindingPair>_>
  *this_01;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_02;
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  TypeID TVar7;
  ID IVar8;
  uint uVar9;
  long lVar10;
  SPIRVariable *pSVar11;
  mapped_type *pmVar12;
  size_type sVar13;
  size_type sVar14;
  bool *pbVar15;
  SPIRType *pSVar16;
  SPIRVariable *pSVar17;
  undefined4 extraout_var;
  SPIRType *pSVar18;
  Resource *pRVar19;
  MSLResourceBinding *rez_bind;
  SPIRType *pSVar20;
  SPIRType *this_03;
  size_type sVar21;
  mapped_type *pmVar22;
  CompilerError *pCVar23;
  AlignedBuffer<Resource,_8UL> *pAVar24;
  uint *puVar25;
  string *ts_1;
  ulong uVar26;
  MSLConstexprSampler *pMVar27;
  Resource *pRVar28;
  CompilerMSL *pCVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  MSLResourceBinding *in_R8;
  Resource *pRVar30;
  SmallVector<Resource,_8UL> *pSVar31;
  uint32_t i;
  long lVar32;
  VectorView<Resource> *pVVar33;
  _func_int **pp_Var34;
  byte bVar35;
  CompilerMSL *pCVar36;
  bool needs_buffer_sizes;
  uint32_t var_id;
  uint32_t local_138c;
  SPIRVariable *local_1388;
  uint local_137c;
  SmallVector<Resource,_8UL> *local_1378;
  ulong local_1370;
  uint32_t next_arg_buff_index;
  uint32_t member_index;
  MSLConstexprSampler *local_1360;
  SPIRType *local_1358;
  Resource *local_1350;
  ParsedIR *local_1348;
  long local_1340;
  uint32_t ptr_type_id;
  LoopLock local_1330 [4];
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *local_1310;
  uint32_t uint_ptr_type_id;
  bool set_needs_buffer_sizes [8];
  SPIRType uint_type_pointer;
  bool set_needs_swizzle_buffer [8];
  SmallVector<unsigned_int,_8UL> inline_block_vars;
  string local_1138;
  string local_1118;
  SmallVector<Resource,_8UL> resources_in_set [8];
  
  bVar35 = 0;
  for (lVar10 = 0x3010; lVar10 != 0x3030; lVar10 = lVar10 + 4) {
    pcVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.aligned_char +
             lVar10 + -0x40;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  lVar10 = 0x10c0;
  pAVar24 = &resources_in_set[0].stack_storage;
  do {
    *(undefined8 *)((long)(pAVar24 + -1) + 0x1f0) = 0;
    *(AlignedBuffer<Resource,_8UL> **)((long)(pAVar24 + -1) + 0x1e8) = pAVar24;
    *(undefined8 *)((long)(pAVar24 + -1) + 0x1f8) = 8;
    pAVar24 = (AlignedBuffer<Resource,_8UL> *)((long)(pAVar24 + 1) + 0x18);
    lVar10 = lVar10 + -0x218;
  } while (lVar10 != 0);
  inline_block_vars.super_VectorView<unsigned_int>.ptr = (uint *)&inline_block_vars.stack_storage;
  inline_block_vars.super_VectorView<unsigned_int>.buffer_size = 0;
  set_needs_swizzle_buffer[0] = false;
  set_needs_swizzle_buffer[1] = false;
  set_needs_swizzle_buffer[2] = false;
  set_needs_swizzle_buffer[3] = false;
  set_needs_swizzle_buffer[4] = false;
  set_needs_swizzle_buffer[5] = false;
  set_needs_swizzle_buffer[6] = false;
  set_needs_swizzle_buffer[7] = false;
  set_needs_buffer_sizes[0] = false;
  set_needs_buffer_sizes[1] = false;
  set_needs_buffer_sizes[2] = false;
  set_needs_buffer_sizes[3] = false;
  set_needs_buffer_sizes[4] = false;
  set_needs_buffer_sizes[5] = false;
  set_needs_buffer_sizes[6] = false;
  set_needs_buffer_sizes[7] = false;
  inline_block_vars.buffer_capacity = 8;
  needs_buffer_sizes = false;
  local_1348 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_1348);
  pSVar17 = (SPIRVariable *)
            (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_1388 = (SPIRVariable *)
               ((long)(&(pSVar17->dereference_chain).stack_storage + -2) + 8 +
               (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size * 4);
  this_00 = &this->constexpr_samplers_by_id;
  local_1310 = (SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *)
               &(this->super_CompilerGLSL).super_Compiler.interlocked_resources;
  this_01 = &this->inline_uniform_blocks;
  this_02 = &this->atomic_image_vars;
  do {
    if (pSVar17 == local_1388) {
      pCVar36 = this;
      ParsedIR::LoopLock::~LoopLock(local_1330);
      if ((this->needs_swizzle_buffer_def != false) || (needs_buffer_sizes == true)) {
        uint_ptr_type_id = 0;
        pSVar31 = resources_in_set;
        this = pCVar36;
        for (lVar10 = 0; pCVar36 = this, lVar10 != 8; lVar10 = lVar10 + 1) {
          bVar4 = set_needs_swizzle_buffer[lVar10];
          if ((bVar4 != false) || (set_needs_buffer_sizes[lVar10] == true)) {
            if (uint_ptr_type_id == 0) {
              uint_ptr_type_id = ParsedIR::increase_bound_by(local_1348,1);
              pSVar16 = get_uint_type(this);
              SPIRType::SPIRType(&uint_type_pointer,pSVar16);
              uint_type_pointer.pointer = true;
              uint_type_pointer.pointer_depth = uint_type_pointer.pointer_depth + 1;
              pCVar36 = this;
              TVar7.id = get_uint_type_id(this);
              uint_type_pointer.parent_type.id = TVar7.id;
              uint_type_pointer.storage = StorageClassUniform;
              Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                        ((Compiler *)this,uint_ptr_type_id,&uint_type_pointer);
              Compiler::set_decoration
                        ((Compiler *)this,(ID)uint_ptr_type_id,DecorationArrayStride,4);
              SPIRType::~SPIRType(&uint_type_pointer);
            }
            pCVar29 = pCVar36;
            if (bVar4 != false) {
              IVar8.id = ParsedIR::increase_bound_by(local_1348,1);
              uint_type_pointer.super_IVariant._vptr_IVariant =
                   (_func_int **)
                   ((ulong)uint_type_pointer.super_IVariant._vptr_IVariant & 0xffffffff00000000);
              pSVar17 = Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                  ((Compiler *)pCVar36,IVar8.id,&uint_ptr_type_id,
                                   (StorageClass *)&uint_type_pointer);
              ::std::__cxx11::string::string
                        ((string *)&uint_type_pointer,"spvSwizzleConstants",(allocator *)local_1330)
              ;
              pCVar29 = pCVar36;
              Compiler::set_name((Compiler *)pCVar36,IVar8,(string *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)&uint_type_pointer);
              Compiler::set_decoration
                        ((Compiler *)pCVar36,IVar8,DecorationDescriptorSet,(uint32_t)lVar10);
              Compiler::set_decoration((Compiler *)pCVar36,IVar8,DecorationBinding,0xfffffffe);
              uint_type_pointer.super_IVariant.self.id = 0;
              uint_type_pointer.super_IVariant._12_4_ = 0;
              uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar17;
              (*(pCVar36->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&uint_type_pointer.width,pCVar36,(ulong)IVar8.id);
              uint_type_pointer.array.buffer_capacity =
                   CONCAT44(uint_type_pointer.array.buffer_capacity._4_4_,8);
              uVar5 = get_metal_resource_index(pCVar36,pSVar17,UInt,0);
              uint_type_pointer.array.buffer_capacity =
                   CONCAT44(uVar5,(undefined4)uint_type_pointer.array.buffer_capacity);
              uint_type_pointer.array.stack_storage.aligned_char[0] = '\0';
              uint_type_pointer.array.stack_storage.aligned_char[1] = '\0';
              uint_type_pointer.array.stack_storage.aligned_char[2] = '\0';
              uint_type_pointer.array.stack_storage.aligned_char[3] = '\0';
              SmallVector<Resource,_8UL>::push_back(pSVar31,(Resource *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)&uint_type_pointer.width);
            }
            this = pCVar29;
            if (set_needs_buffer_sizes[lVar10] == true) {
              IVar8.id = ParsedIR::increase_bound_by(local_1348,1);
              uint_type_pointer.super_IVariant._vptr_IVariant =
                   (_func_int **)
                   ((ulong)uint_type_pointer.super_IVariant._vptr_IVariant & 0xffffffff00000000);
              pSVar17 = Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                  ((Compiler *)pCVar29,IVar8.id,&uint_ptr_type_id,
                                   (StorageClass *)&uint_type_pointer);
              ::std::__cxx11::string::string
                        ((string *)&uint_type_pointer,"spvBufferSizeConstants",
                         (allocator *)local_1330);
              this = pCVar29;
              Compiler::set_name((Compiler *)pCVar29,IVar8,(string *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)&uint_type_pointer);
              Compiler::set_decoration
                        ((Compiler *)pCVar29,IVar8,DecorationDescriptorSet,(uint32_t)lVar10);
              Compiler::set_decoration((Compiler *)pCVar29,IVar8,DecorationBinding,0xfffffffd);
              uint_type_pointer.super_IVariant.self.id = 0;
              uint_type_pointer.super_IVariant._12_4_ = 0;
              uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar17;
              (*(pCVar29->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&uint_type_pointer.width,pCVar29,(ulong)IVar8.id);
              uint_type_pointer.array.buffer_capacity =
                   CONCAT44(uint_type_pointer.array.buffer_capacity._4_4_,8);
              uVar5 = get_metal_resource_index(pCVar29,pSVar17,UInt,0);
              uint_type_pointer.array.buffer_capacity =
                   CONCAT44(uVar5,(undefined4)uint_type_pointer.array.buffer_capacity);
              uint_type_pointer.array.stack_storage.aligned_char[0] = '\0';
              uint_type_pointer.array.stack_storage.aligned_char[1] = '\0';
              uint_type_pointer.array.stack_storage.aligned_char[2] = '\0';
              uint_type_pointer.array.stack_storage.aligned_char[3] = '\0';
              SmallVector<Resource,_8UL>::push_back(pSVar31,(Resource *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)&uint_type_pointer.width);
            }
          }
          pSVar31 = pSVar31 + 1;
        }
      }
      puVar25 = inline_block_vars.super_VectorView<unsigned_int>.ptr;
      lVar10 = inline_block_vars.super_VectorView<unsigned_int>.buffer_size << 2;
      for (lVar32 = 0; lVar10 != lVar32; lVar32 = lVar32 + 4) {
        IVar8.id = *(uint32_t *)((long)puVar25 + lVar32);
        pSVar17 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,IVar8.id);
        uVar5 = Compiler::get_decoration((Compiler *)this,IVar8,DecorationDescriptorSet);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,IVar8.id);
        uint_type_pointer.super_IVariant.self.id = 0;
        uint_type_pointer.super_IVariant._12_4_ = 0;
        uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar17;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&uint_type_pointer.width,this,(ulong)IVar8.id);
        uint_type_pointer.array.buffer_capacity =
             CONCAT44(uint_type_pointer.array.buffer_capacity._4_4_,0xf);
        uVar6 = get_metal_resource_index(this,pSVar17,Struct,0);
        uint_type_pointer.array.buffer_capacity =
             CONCAT44(uVar6,(undefined4)uint_type_pointer.array.buffer_capacity);
        uint_type_pointer.array.stack_storage.aligned_char[0] = '\0';
        uint_type_pointer.array.stack_storage.aligned_char[1] = '\0';
        uint_type_pointer.array.stack_storage.aligned_char[2] = '\0';
        uint_type_pointer.array.stack_storage.aligned_char[3] = '\0';
        SmallVector<Resource,_8UL>::push_back
                  ((SmallVector<Resource,_8UL> *)&resources_in_set[uVar5].super_VectorView<Resource>
                   ,(Resource *)&uint_type_pointer);
        ::std::__cxx11::string::~string((string *)&uint_type_pointer.width);
      }
      local_1358 = (SPIRType *)&this->plane_name_suffix;
      local_1360 = (MSLConstexprSampler *)&this->buffers_requiring_dynamic_offset;
      local_1310 = &this->buffer_aliases_argument;
      uVar9 = 0;
      do {
        local_137c = uVar9;
        if (7 < uVar9) {
          SmallVector<unsigned_int,_8UL>::~SmallVector(&inline_block_vars);
          lVar10 = 0xea8;
          do {
            SmallVector<Resource,_8UL>::~SmallVector
                      ((SmallVector<Resource,_8UL> *)
                       (resources_in_set[0].stack_storage.aligned_char + lVar10 + -0x18));
            lVar10 = lVar10 + -0x218;
          } while (lVar10 != -0x218);
          return;
        }
        if (resources_in_set[uVar9].super_VectorView<Resource>.buffer_size != 0) {
          if (((this->msl_options).argument_buffers != true) ||
             ((this->argument_buffer_discrete_mask >> (uVar9 & 0x1f) & 1) != 0)) {
            __assert_fail("descriptor_set_is_argument_buffer(desc_set)",
                          "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                          ,0x43c9,"void spirv_cross::CompilerMSL::analyze_argument_buffers()");
          }
          uVar5 = ParsedIR::increase_bound_by(local_1348,3);
          local_1370 = CONCAT44(extraout_var,uVar5);
          IVar8.id = uVar5 + 1;
          ptr_type_id = uVar5 + 2;
          this->argument_buffer_ids[local_137c] = uVar5;
          pSVar16 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,IVar8.id);
          *(undefined4 *)&(pSVar16->super_IVariant).field_0xc = 0xf;
          puVar25 = (uint *)(ulong)local_137c;
          if ((this->argument_buffer_device_storage_mask >> (local_137c & 0x1f) & 1) == 0) {
            pSVar16->storage = StorageClassUniform;
          }
          else {
            pSVar16->storage = StorageClassStorageBuffer;
            Compiler::set_decoration
                      ((Compiler *)this,(ID)(uint32_t)local_1370,DecorationNonWritable,0);
            puVar25 = (uint *)0x0;
            Compiler::set_decoration((Compiler *)this,IVar8,DecorationBlock,0);
          }
          join<char_const(&)[23],unsigned_int&>
                    ((string *)&uint_type_pointer,(spirv_cross *)"spvDescriptorSetBuffer",
                     (char (*) [23])&local_137c,puVar25);
          Compiler::set_name((Compiler *)this,IVar8,(string *)&uint_type_pointer);
          ::std::__cxx11::string::~string((string *)&uint_type_pointer);
          pSVar18 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,ptr_type_id);
          SPIRType::operator=(pSVar18,pSVar16);
          pSVar18->pointer = true;
          pSVar18->pointer_depth = pSVar18->pointer_depth + 1;
          (pSVar18->parent_type).id = IVar8.id;
          uint_type_pointer.super_IVariant._vptr_IVariant =
               (_func_int **)CONCAT44(uint_type_pointer.super_IVariant._vptr_IVariant._4_4_,2);
          pSVar18 = &uint_type_pointer;
          Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                    ((Compiler *)this,(uint32_t)local_1370,&ptr_type_id,
                     (StorageClass *)&uint_type_pointer);
          join<char_const(&)[17],unsigned_int&>
                    ((string *)&uint_type_pointer,(spirv_cross *)"spvDescriptorSet",
                     (char (*) [17])&local_137c,(uint *)pSVar18);
          Compiler::set_name((Compiler *)this,(ID)(uint32_t)local_1370,(string *)&uint_type_pointer)
          ;
          pVVar33 = &resources_in_set[uVar9].super_VectorView<Resource>;
          ::std::__cxx11::string::~string((string *)&uint_type_pointer);
          pRVar30 = pVVar33->ptr;
          sVar3 = resources_in_set[uVar9].super_VectorView<Resource>.buffer_size;
          local_1388 = (SPIRVariable *)pVVar33;
          if (sVar3 == 0) {
            lVar10 = 0;
          }
          else {
            uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)((long)(sVar3 + 1) / 2);
            uint_type_pointer.super_IVariant.self.id = 0;
            uint_type_pointer.super_IVariant._12_4_ = 0;
            uint_type_pointer.width = 0;
            uint_type_pointer.vecsize = 0;
            pp_Var34 = uint_type_pointer.super_IVariant._vptr_IVariant;
            this = pCVar36;
LAB_002fa75f:
            if ((long)pp_Var34 < 1) {
              ::std::
              __inplace_stable_sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                        (pRVar30,pRVar30 + sVar3);
            }
            else {
              uVar26 = (long)pp_Var34 << 6;
              pRVar19 = (Resource *)operator_new(uVar26,(nothrow_t *)&::std::nothrow);
              if (pRVar19 == (Resource *)0x0) goto code_r0x002fa77f;
              analyze_argument_buffers::Resource::Resource((Resource *)pRVar19,pRVar30);
              pRVar28 = pRVar19;
              while (uVar26 = uVar26 - 0x40, uVar26 != 0) {
                analyze_argument_buffers::Resource::Resource((Resource *)(pRVar28 + 1),pRVar28);
                pRVar28 = pRVar28 + 1;
              }
              analyze_argument_buffers::Resource::operator=((Resource *)pRVar30,pRVar28);
              uint_type_pointer.width = (uint32_t)pRVar19;
              uint_type_pointer.vecsize = (uint32_t)((ulong)pRVar19 >> 0x20);
              uint_type_pointer.super_IVariant.self.id = (uint32_t)pp_Var34;
              uint_type_pointer.super_IVariant._12_4_ = SUB84((ulong)pp_Var34 >> 0x20,0);
              ::std::
              __stable_sort_adaptive<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                        (pRVar30,pRVar30 + sVar3,pRVar19,pp_Var34);
            }
            ::std::_Temporary_buffer<Resource_*,_Resource>::~_Temporary_buffer
                      ((_Temporary_buffer<Resource_*,_Resource> *)&uint_type_pointer);
            pRVar30 = (Resource *)(local_1388->super_IVariant)._vptr_IVariant;
            lVar10 = *(long *)&(local_1388->super_IVariant).self;
            pCVar36 = this;
          }
          member_index = 0;
          next_arg_buff_index = 0;
          local_1350 = pRVar30 + lVar10;
          local_1378 = (SmallVector<Resource,_8UL> *)&pSVar16->member_types;
          for (; pRVar30 != local_1350; pRVar30 = pRVar30 + 1) {
            local_1388 = pRVar30->var;
            pSVar18 = Compiler::get_variable_data_type((Compiler *)this,local_1388);
            if ((this->msl_options).pad_argument_buffer_resources == true) {
              if (pRVar30->descriptor_alias == (SPIRVariable *)0x0) {
                while (next_arg_buff_index < pRVar30->index) {
                  rez_bind = get_argument_buffer_resource(this,local_137c,next_arg_buff_index);
                  switch(rez_bind->basetype) {
                  case Void:
                  case Boolean:
                  case SByte:
                  case UByte:
                  case Short:
                  case UShort:
                  case Int:
                  case UInt:
                  case Int64:
                  case UInt64:
                  case AtomicCounter:
                  case Half:
                  case Float:
                  case Double:
                    add_argument_buffer_padding_buffer_type
                              (this,pSVar16,&member_index,&next_arg_buff_index,rez_bind);
                    in_R8 = rez_bind;
                    break;
                  case SampledImage:
                    if (next_arg_buff_index == rez_bind->msl_sampler)
                    goto switchD_002fa8ae_caseD_12;
                  case Image:
                    add_argument_buffer_padding_image_type
                              (this,pSVar16,&member_index,&next_arg_buff_index,rez_bind);
                    in_R8 = rez_bind;
                    break;
                  case Sampler:
switchD_002fa8ae_caseD_12:
                    add_argument_buffer_padding_sampler_type
                              (this,pSVar16,&member_index,&next_arg_buff_index,rez_bind);
                    in_R8 = rez_bind;
                  }
                }
              }
              uVar5 = 1;
              if (((pSVar18->array).super_VectorView<unsigned_int>.buffer_size != 0) &&
                 (uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar18),
                 uVar5 == 0)) {
                uVar5 = get_resource_array_size(this,(local_1388->super_IVariant).self.id);
              }
              next_arg_buff_index = next_arg_buff_index + uVar5;
            }
            ::std::__cxx11::string::string((string *)&local_1118,(string *)&pRVar30->name);
            pCVar29 = (CompilerMSL *)0x3b2f7f;
            ::std::__cxx11::string::string
                      ((string *)&local_1138,"m",(allocator *)&uint_type_pointer);
            ts_1 = &local_1138;
            ensure_valid_name((string *)&uint_ptr_type_id,pCVar29,&local_1118,&local_1138);
            ::std::__cxx11::string::~string((string *)&local_1138);
            ::std::__cxx11::string::~string((string *)&local_1118);
            if (pRVar30->plane != 0) {
              join<std::__cxx11::string&,unsigned_int&>
                        ((string *)&uint_type_pointer,(spirv_cross *)local_1358,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pRVar30->plane,(uint *)ts_1);
              ::std::__cxx11::string::append((string *)&uint_ptr_type_id);
              ::std::__cxx11::string::~string((string *)&uint_type_pointer);
            }
            uVar5 = member_index;
            Compiler::set_member_name
                      ((Compiler *)this,(TypeID)(pSVar16->super_IVariant).self.id,member_index,
                       (string *)&uint_ptr_type_id);
            local_1340 = CONCAT44(local_1340._4_4_,uVar5);
            if ((pRVar30->basetype == Sampler) &&
               (*(int *)&(pSVar18->super_IVariant).field_0xc != 0x12)) {
              sVar3 = (pSVar18->array).super_VectorView<unsigned_int>.buffer_size;
              uVar5 = ParsedIR::increase_bound_by(local_1348,2 - (sVar3 == 0));
              pSVar20 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar36,uVar5);
              pSVar20->storage = StorageClassUniformConstant;
              *(undefined4 *)&(pSVar20->super_IVariant).field_0xc = 0x12;
              if (sVar3 == 0) {
                uint_type_pointer.super_IVariant._vptr_IVariant =
                     (_func_int **)
                     CONCAT44(uint_type_pointer.super_IVariant._vptr_IVariant._4_4_,uVar5);
                this = pCVar36;
              }
              else {
                this_03 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar36,uVar5 + 1);
                SPIRType::operator=(this_03,pSVar20);
                SmallVector<unsigned_int,_8UL>::operator=(&this_03->array,&pSVar18->array);
                SmallVector<bool,_8UL>::operator=
                          (&this_03->array_size_literal,&pSVar18->array_size_literal);
                (this_03->parent_type).id = uVar5;
                uint_type_pointer.super_IVariant._vptr_IVariant =
                     (_func_int **)
                     CONCAT44(uint_type_pointer.super_IVariant._vptr_IVariant._4_4_,uVar5 + 1);
                this = pCVar36;
              }
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                        ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)local_1378
                         ,(TypedID<(spirv_cross::Types)1> *)&uint_type_pointer);
              pCVar36 = this;
            }
            else {
              local_138c = Compiler::get_decoration
                                     ((Compiler *)this,(ID)(local_1388->super_IVariant).self.id,
                                      DecorationBinding);
              var_id = local_137c;
              if (pRVar30->basetype - Image < 3) {
                uVar5 = Compiler::get_variable_data_type_id((Compiler *)this,local_1388);
                uint_type_pointer.super_IVariant._vptr_IVariant =
                     (_func_int **)
                     CONCAT44(uint_type_pointer.super_IVariant._vptr_IVariant._4_4_,uVar5);
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                          ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                           local_1378,(TypedID<(spirv_cross::Types)1> *)&uint_type_pointer);
                if (pRVar30->plane != 0) goto LAB_002fac74;
                uVar5 = (local_1388->super_IVariant).self.id;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          ((spirv_cross *)local_1330,this,local_1370,1);
                join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                          ((string *)&uint_type_pointer,(spirv_cross *)local_1330,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x39e0a7,(char (*) [2])&uint_ptr_type_id,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_R8);
                Compiler::set_qualified_name((Compiler *)this,uVar5,(string *)&uint_type_pointer);
              }
              else {
                sVar21 = ::std::
                         map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                         ::count((map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                  *)local_1360,(key_type *)&var_id);
                pSVar17 = local_1388;
                if (sVar21 != 0) {
                  if (pRVar30->descriptor_alias != (SPIRVariable *)0x0) {
                    pCVar23 = (CompilerError *)__cxa_allocate_exception(0x10);
                    ::std::__cxx11::string::string
                              ((string *)&uint_type_pointer,
                               "Descriptor aliasing is currently not supported with dynamic offsets."
                               ,(allocator *)local_1330);
                    CompilerError::CompilerError(pCVar23,(string *)&uint_type_pointer);
                    __cxa_throw(pCVar23,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                            ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                             local_1378,
                             (TypedID<(spirv_cross::Types)1> *)
                             &(local_1388->super_IVariant).field_0xc);
                  uVar5 = (pSVar17->super_IVariant).self.id;
                  pmVar22 = ::std::
                            map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                            ::operator[]((map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                          *)local_1360,(key_type *)&var_id);
                  pmVar22->second = uVar5;
                  goto LAB_002fac74;
                }
                sVar13 = ::std::
                         _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::count(&this_01->_M_h,(key_type *)&var_id);
                pSVar17 = local_1388;
                if (sVar13 != 0) {
                  if (pRVar30->descriptor_alias != (SPIRVariable *)0x0) {
                    pCVar23 = (CompilerError *)__cxa_allocate_exception(0x10);
                    ::std::__cxx11::string::string
                              ((string *)&uint_type_pointer,
                               "Descriptor aliasing is currently not supported with inline UBOs.",
                               (allocator *)local_1330);
                    CompilerError::CompilerError(pCVar23,(string *)&uint_type_pointer);
                    __cxa_throw(pCVar23,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  uVar5 = Compiler::get_variable_data_type_id((Compiler *)this,local_1388);
                  uint_type_pointer.super_IVariant._vptr_IVariant =
                       (_func_int **)
                       CONCAT44(uint_type_pointer.super_IVariant._vptr_IVariant._4_4_,uVar5);
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                            ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                             local_1378,(TypedID<(spirv_cross::Types)1> *)&uint_type_pointer);
                  uVar5 = (pSVar17->super_IVariant).self.id;
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            ((spirv_cross *)local_1330,this,local_1370,1);
                  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                            ((string *)&uint_type_pointer,(spirv_cross *)local_1330,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x39e0a7,(char (*) [2])&uint_ptr_type_id,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_R8);
                  Compiler::set_qualified_name((Compiler *)this,uVar5,(string *)&uint_type_pointer);
                  goto LAB_002fac62;
                }
                uint_type_pointer.super_IVariant._vptr_IVariant =
                     (_func_int **)
                     CONCAT44(uint_type_pointer.super_IVariant._vptr_IVariant._4_4_,
                              (local_1388->super_IVariant).self.id);
                sVar14 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&this_02->_M_h,(key_type *)&uint_type_pointer);
                if (sVar14 != 0) {
                  TVar7.id = ParsedIR::increase_bound_by(local_1348,2);
                  uint_type_pointer.super_IVariant.self.id = 0;
                  uint_type_pointer.super_IVariant._vptr_IVariant =
                       (_func_int **)&PTR__SPIRType_00464260;
                  uint_type_pointer.vecsize = 1;
                  uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size = 0;
                  uint_type_pointer.array.super_VectorView<unsigned_int>.ptr =
                       (uint *)&uint_type_pointer.array.stack_storage;
                  uint_type_pointer.array.buffer_capacity = 8;
                  uint_type_pointer.array_size_literal.super_VectorView<bool>.buffer_size = 0;
                  uint_type_pointer.array_size_literal.super_VectorView<bool>.ptr =
                       (bool *)&uint_type_pointer.array_size_literal.stack_storage;
                  uint_type_pointer.array_size_literal.buffer_capacity = 8;
                  uint_type_pointer.pointer_depth = 0;
                  uint_type_pointer.pointer = false;
                  uint_type_pointer.forward_pointer = false;
                  uint_type_pointer.storage = StorageClassGeneric;
                  uint_type_pointer.member_types.
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
                  uint_type_pointer.member_types.
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
                       (TypedID<(spirv_cross::Types)1> *)
                       &uint_type_pointer.member_types.stack_storage;
                  uint_type_pointer.member_types.buffer_capacity = 8;
                  uint_type_pointer.member_type_index_redirection.super_VectorView<unsigned_int>.
                  buffer_size = 0;
                  uint_type_pointer.member_type_index_redirection.super_VectorView<unsigned_int>.ptr
                       = (uint *)&uint_type_pointer.member_type_index_redirection.stack_storage;
                  uint_type_pointer.member_type_index_redirection.buffer_capacity = 8;
                  uint_type_pointer.image.type.id = 0;
                  uint_type_pointer.type_alias.id = 0;
                  uint_type_pointer.parent_type.id = 0;
                  uint_type_pointer.member_name_cache._M_h._M_buckets =
                       &uint_type_pointer.member_name_cache._M_h._M_single_bucket;
                  uint_type_pointer.member_name_cache._M_h._M_bucket_count = 1;
                  uint_type_pointer.member_name_cache._M_h._M_before_begin._M_nxt =
                       (_Hash_node_base *)0x0;
                  uint_type_pointer.member_name_cache._M_h._M_element_count = 0;
                  uint_type_pointer.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0
                  ;
                  uint_type_pointer.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
                  uint_type_pointer.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
                  uint_type_pointer.super_IVariant._12_4_ = 0xb;
                  uint_type_pointer.width = 0x20;
                  uint_type_pointer.columns = uint_type_pointer.vecsize;
                  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                            ((Compiler *)this,TVar7.id,&uint_type_pointer);
                  uint_type_pointer.pointer = true;
                  uint_type_pointer.pointer_depth = uint_type_pointer.pointer_depth + 1;
                  uint_type_pointer.parent_type.id = TVar7.id;
                  uint_type_pointer.storage = StorageClassStorageBuffer;
                  pSVar18 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                      ((Compiler *)this,TVar7.id + 1,&uint_type_pointer);
                  (pSVar18->super_IVariant).self.id = TVar7.id;
                  local_1330[0].lock._0_4_ = TVar7.id + 1;
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                            ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                             local_1378,(TypedID<(spirv_cross::Types)1> *)local_1330);
                  SPIRType::~SPIRType(&uint_type_pointer);
                  goto LAB_002fac74;
                }
                pSVar17 = pRVar30->descriptor_alias;
                if ((pSVar17 == (SPIRVariable *)0x0) || (pSVar11 = pRVar30->var, pSVar17 == pSVar11)
                   ) {
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                            ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                             local_1378,
                             (TypedID<(spirv_cross::Types)1> *)
                             &(local_1388->super_IVariant).field_0xc);
                  pSVar17 = pRVar30->descriptor_alias;
                  if (pSVar17 != (SPIRVariable *)0x0) {
                    pSVar11 = pRVar30->var;
                    goto LAB_002faee1;
                  }
                }
                else {
LAB_002faee1:
                  if (pSVar17 != pSVar11) {
                    uint_type_pointer.super_IVariant._vptr_IVariant =
                         (_func_int **)
                         CONCAT44((pSVar17->super_IVariant).self.id,
                                  (local_1388->super_IVariant).self.id);
                    SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL>::push_back
                              (local_1310,(pair<unsigned_int,_unsigned_int> *)&uint_type_pointer);
                    goto LAB_002fac74;
                  }
                }
                uVar5 = (local_1388->super_IVariant).self.id;
                if ((pSVar18->array).super_VectorView<unsigned_int>.buffer_size == 0) {
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (local_1330,this,local_1370,1);
                  join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            ((string *)&uint_type_pointer,(spirv_cross *)"(*",
                             (char (*) [3])local_1330,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x39e0a7,(char (*) [2])&uint_ptr_type_id,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x39e39a,(char (*) [2])pCVar36);
                  Compiler::set_qualified_name((Compiler *)this,uVar5,(string *)&uint_type_pointer);
                }
                else {
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            ((spirv_cross *)local_1330,this,local_1370,1);
                  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                            ((string *)&uint_type_pointer,(spirv_cross *)local_1330,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x39e0a7,(char (*) [2])&uint_ptr_type_id,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_R8);
                  Compiler::set_qualified_name((Compiler *)this,uVar5,(string *)&uint_type_pointer);
                }
              }
LAB_002fac62:
              ::std::__cxx11::string::~string((string *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)local_1330);
            }
LAB_002fac74:
            uVar5 = (uint32_t)local_1340;
            Compiler::set_extended_member_decoration
                      ((Compiler *)this,(pSVar16->super_IVariant).self.id,(uint32_t)local_1340,
                       SPIRVCrossDecorationResourceIndexPrimary,pRVar30->index);
            uVar9 = (local_1388->super_IVariant).self.id;
            in_R8 = (MSLResourceBinding *)(ulong)uVar9;
            Compiler::set_extended_member_decoration
                      ((Compiler *)this,(pSVar16->super_IVariant).self.id,uVar5,
                       SPIRVCrossDecorationInterfaceOrigID,uVar9);
            member_index = uVar5 + 1;
            ::std::__cxx11::string::~string((string *)&uint_ptr_type_id);
          }
        }
        uVar9 = local_137c + 1;
      } while( true );
    }
    IVar8.id = *(uint32_t *)&(pSVar17->super_IVariant)._vptr_IVariant;
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [IVar8.id].type == TypeVariable) {
      pSVar11 = ParsedIR::get<spirv_cross::SPIRVariable>(local_1348,IVar8.id);
      if (((pSVar11->storage < (StorageClassStorageBuffer|StorageClassInput)) &&
          ((0x1005U >> (pSVar11->storage & 0x1f) & 1) != 0)) &&
         (bVar4 = Compiler::is_hidden_variable((Compiler *)this,pSVar11,false), !bVar4)) {
        uVar5 = Compiler::get_decoration((Compiler *)this,IVar8,DecorationDescriptorSet);
        local_1378 = (SmallVector<Resource,_8UL> *)CONCAT44(local_1378._4_4_,uVar5);
        if (((uVar5 < 8) && ((this->msl_options).argument_buffers != false)) &&
           ((this->argument_buffer_discrete_mask >> (uVar5 & 0x1f) & 1) == 0)) {
          uVar5 = (pSVar11->super_IVariant).self.id;
          var_id = uVar5;
          local_1358 = Compiler::get_variable_data_type((Compiler *)this,pSVar11);
          if ((*(int *)&(local_1358->super_IVariant).field_0xc - 0x11U < 2) &&
             (local_1360 = find_constexpr_sampler(this,uVar5),
             local_1360 != (MSLConstexprSampler *)0x0)) {
            pmVar12 = ::std::
                      map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                      ::operator[](this_00,&var_id);
            pMVar27 = local_1360;
            for (lVar10 = 0x19; lVar10 != 0; lVar10 = lVar10 + -1) {
              pmVar12->coord = pMVar27->coord;
              pMVar27 = (MSLConstexprSampler *)((long)pMVar27 + (ulong)bVar35 * -8 + 4);
              pmVar12 = (mapped_type *)((long)pmVar12 + (ulong)bVar35 * -8 + 4);
            }
          }
          else {
            local_1360 = (MSLConstexprSampler *)0x0;
          }
          local_1370 = (ulong)local_1378 & 0xffffffff;
          if ((pSVar11->storage == StorageClassStorageBuffer) ||
             (pSVar11->storage == StorageClassUniform)) {
            pRVar30 = resources_in_set[local_1370].super_VectorView<Resource>.ptr;
            local_1340 = resources_in_set[local_1370].super_VectorView<Resource>.buffer_size << 6;
            pCVar36 = this;
            for (lVar10 = 0; this = pCVar36, local_1340 != lVar10; lVar10 = lVar10 + 0x40) {
              uVar5 = Compiler::get_decoration
                                ((Compiler *)pCVar36,
                                 (ID)*(uint32_t *)(*(long *)((long)&pRVar30->var + lVar10) + 8),
                                 DecorationBinding);
              uVar6 = Compiler::get_decoration((Compiler *)pCVar36,(ID)var_id,DecorationBinding);
              if (((uVar5 == uVar6) && (*(int *)((long)&pRVar30->basetype + lVar10) == 0xf)) &&
                 (*(int *)&(local_1358->super_IVariant).field_0xc == 0xf)) {
                pRVar19 = *(Resource **)((long)&pRVar30->var + lVar10);
                iVar2 = *(int *)&(pRVar19->name)._M_dataplus._M_p;
                if ((iVar2 == 0xc) || (iVar2 == 2)) {
                  *(Resource **)((long)&pRVar30->descriptor_alias + lVar10) = pRVar19;
                  local_1350 = pRVar19;
                  sVar14 = ::std::
                           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                    *)local_1310,&var_id);
                  if (sVar14 != 0) {
                    uint_type_pointer.super_IVariant._vptr_IVariant =
                         (_func_int **)
                         CONCAT44(uint_type_pointer.super_IVariant._vptr_IVariant._4_4_,
                                  *(undefined4 *)(*(long *)((long)&pRVar30->var + lVar10) + 8));
                    ::std::__detail::
                    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                              *)local_1310,(value_type *)&uint_type_pointer);
                  }
                  goto LAB_002f9d5a;
                }
              }
              pCVar36 = this;
            }
          }
          local_1350 = (Resource *)0x0;
LAB_002f9d5a:
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &uint_ptr_type_id;
          uVar5 = Compiler::get_decoration((Compiler *)this,(ID)var_id,DecorationBinding);
          if (*(int *)&(local_1358->super_IVariant).field_0xc == 0x11) {
            CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,var_id);
            local_1340 = CONCAT44(local_1340._4_4_,1);
            if ((local_1360 != (MSLConstexprSampler *)0x0) &&
               (local_1340 = CONCAT44(local_1340._4_4_,1),
               local_1360->ycbcr_conversion_enable == true)) {
              local_1340 = CONCAT44(local_1340._4_4_,local_1360->planes);
            }
            local_1378 = (SmallVector<Resource,_8UL> *)
                         &resources_in_set[local_1370].super_VectorView<Resource>;
            for (uVar5 = 0; (uint32_t)local_1340 != uVar5; uVar5 = uVar5 + 1) {
              pCVar36 = this;
              uVar6 = get_metal_resource_index(this,pSVar11,Image,uVar5);
              uint_type_pointer.super_IVariant.self.id = (uint32_t)local_1350;
              uint_type_pointer.super_IVariant._12_4_ = SUB84((ulong)local_1350 >> 0x20,0);
              uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar11;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&uint_type_pointer.width,this,(ulong)var_id);
              uint_type_pointer.array.buffer_capacity = CONCAT44(uVar6,0x10);
              uint_type_pointer.array.stack_storage.aligned_char._0_4_ = uVar5;
              SmallVector<Resource,_8UL>::push_back(local_1378,(Resource *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)&uint_type_pointer.width);
              this = pCVar36;
            }
            if ((local_1360 == (MSLConstexprSampler *)0x0) && ((local_1358->image).dim != DimBuffer)
               ) {
              uVar5 = get_metal_resource_index(this,pSVar11,Sampler,0);
              uint_type_pointer.super_IVariant.self.id = (uint32_t)local_1350;
              uint_type_pointer.super_IVariant._12_4_ = SUB84((ulong)local_1350 >> 0x20,0);
              uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar11;
              to_sampler_expression_abi_cxx11_((string *)&uint_type_pointer.width,this,var_id);
              uint_type_pointer.array.buffer_capacity = CONCAT44(uVar5,0x12);
              uint_type_pointer.array.stack_storage.aligned_char[0] = '\0';
              uint_type_pointer.array.stack_storage.aligned_char[1] = '\0';
              uint_type_pointer.array.stack_storage.aligned_char[2] = '\0';
              uint_type_pointer.array.stack_storage.aligned_char[3] = '\0';
              SmallVector<Resource,_8UL>::push_back(local_1378,(Resource *)&uint_type_pointer);
              __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &uint_type_pointer.width;
LAB_002f9f33:
              ::std::__cxx11::string::~string((string *)__lhs);
            }
          }
          else {
            uint_type_pointer.super_IVariant._vptr_IVariant =
                 (_func_int **)CONCAT44(uVar5,(int)local_1378);
            sVar13 = ::std::
                     _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::count(&this_01->_M_h,(key_type *)&uint_type_pointer);
            if (sVar13 == 0) {
              if ((local_1360 == (MSLConstexprSampler *)0x0) &&
                 (bVar4 = is_supported_argument_buffer_type(this,local_1358), bVar4)) {
                CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,var_id);
                uVar5 = 0xffffffff;
                if (local_1350 == (Resource *)0x0) {
                  uVar5 = get_metal_resource_index
                                    (this,pSVar11,
                                     *(BaseType *)&(local_1358->super_IVariant).field_0xc,0);
                }
                uint_type_pointer.super_IVariant.self.id = (uint32_t)local_1350;
                uint_type_pointer.super_IVariant._12_4_ = SUB84((ulong)local_1350 >> 0x20,0);
                uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar11;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (&uint_type_pointer.width,this,(ulong)var_id);
                pSVar31 = resources_in_set + local_1370;
                uint_type_pointer.array.buffer_capacity =
                     CONCAT44(uVar5,*(undefined4 *)&(local_1358->super_IVariant).field_0xc);
                uint_type_pointer.array.stack_storage.aligned_char[0] = '\0';
                uint_type_pointer.array.stack_storage.aligned_char[1] = '\0';
                uint_type_pointer.array.stack_storage.aligned_char[2] = '\0';
                uint_type_pointer.array.stack_storage.aligned_char[3] = '\0';
                SmallVector<Resource,_8UL>::push_back
                          ((SmallVector<Resource,_8UL> *)&pSVar31->super_VectorView<Resource>,
                           (Resource *)&uint_type_pointer);
                ::std::__cxx11::string::~string((string *)&uint_type_pointer.width);
                uint_type_pointer.super_IVariant._vptr_IVariant =
                     (_func_int **)
                     CONCAT44(uint_type_pointer.super_IVariant._vptr_IVariant._4_4_,
                              (pSVar11->super_IVariant).self.id);
                sVar14 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&this_02->_M_h,(key_type *)&uint_type_pointer);
                if (sVar14 != 0) {
                  uVar5 = get_metal_resource_index(this,pSVar11,AtomicCounter,0);
                  uint_type_pointer.super_IVariant.self.id = (uint32_t)local_1350;
                  uint_type_pointer.super_IVariant._12_4_ = SUB84((ulong)local_1350 >> 0x20,0);
                  uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar11;
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (__lhs,this,(ulong)var_id,1);
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&uint_type_pointer.width,__lhs,"_atomic");
                  uint_type_pointer.array.buffer_capacity = CONCAT44(uVar5,0xf);
                  uint_type_pointer.array.stack_storage.aligned_char[0] = '\0';
                  uint_type_pointer.array.stack_storage.aligned_char[1] = '\0';
                  uint_type_pointer.array.stack_storage.aligned_char[2] = '\0';
                  uint_type_pointer.array.stack_storage.aligned_char[3] = '\0';
                  SmallVector<Resource,_8UL>::push_back
                            ((SmallVector<Resource,_8UL> *)&pSVar31->super_VectorView<Resource>,
                             (Resource *)&uint_type_pointer);
                  ::std::__cxx11::string::~string((string *)&uint_type_pointer.width);
                  goto LAB_002f9f33;
                }
              }
            }
            else {
              SmallVector<unsigned_int,_8UL>::push_back(&inline_block_vars,&var_id);
            }
          }
          if ((this->needs_swizzle_buffer_def == true) &&
             (bVar4 = Compiler::is_sampled_image_type((Compiler *)this,local_1358), bVar4)) {
            pbVar15 = set_needs_swizzle_buffer + local_1370;
          }
          else {
            bVar4 = buffer_requires_array_length(this,(VariableID)var_id);
            if (!bVar4) goto LAB_002fa185;
            set_needs_buffer_sizes[local_1370] = true;
            pbVar15 = &needs_buffer_sizes;
          }
          *pbVar15 = true;
        }
      }
    }
LAB_002fa185:
    pSVar17 = (SPIRVariable *)((long)&(pSVar17->super_IVariant)._vptr_IVariant + 4);
  } while( true );
code_r0x002fa77f:
  uVar26 = (long)pp_Var34 + 1;
  bVar4 = pp_Var34 != (_func_int **)0x1;
  pp_Var34 = (_func_int **)0x0;
  if (bVar4) {
    pp_Var34 = (_func_int **)(uVar26 >> 1);
  }
  goto LAB_002fa75f;
}

Assistant:

void CompilerMSL::analyze_argument_buffers()
{
	// Gather all used resources and sort them out into argument buffers.
	// Each argument buffer corresponds to a descriptor set in SPIR-V.
	// The [[id(N)]] values used correspond to the resource mapping we have for MSL.
	// Otherwise, the binding number is used, but this is generally not safe some types like
	// combined image samplers and arrays of resources. Metal needs different indices here,
	// while SPIR-V can have one descriptor set binding. To use argument buffers in practice,
	// you will need to use the remapping from the API.
	for (auto &id : argument_buffer_ids)
		id = 0;

	// Output resources, sorted by resource index & type.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
	};
	SmallVector<Resource> resources_in_set[kMaxArgumentBuffers];
	SmallVector<uint32_t> inline_block_vars;

	bool set_needs_swizzle_buffer[kMaxArgumentBuffers] = {};
	bool set_needs_buffer_sizes[kMaxArgumentBuffers] = {};
	bool needs_buffer_sizes = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			uint32_t desc_set = get_decoration(self, DecorationDescriptorSet);
			// Ignore if it's part of a push descriptor set.
			if (!descriptor_set_is_argument_buffer(desc_set))
				return;

			uint32_t var_id = var.self;
			auto &type = get_variable_data_type(var);

			if (desc_set >= kMaxArgumentBuffers)
				SPIRV_CROSS_THROW("Descriptor set index is out of range.");

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Handle descriptor aliasing as well as we can.
			// We can handle aliasing of buffers by casting pointers, but not for typed resources.
			// Inline UBOs cannot be handled since it's not a pointer, but inline data.
			SPIRVariable *descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources_in_set[desc_set])
				{
					if (get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			uint32_t binding = get_decoration(var_id, DecorationBinding);
			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
				{
					uint32_t image_resource_index = get_metal_resource_index(var, SPIRType::Image, i);
					resources_in_set[desc_set].push_back(
					    { &var, descriptor_alias, to_name(var_id), SPIRType::Image, image_resource_index, i });
				}

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					uint32_t sampler_resource_index = get_metal_resource_index(var, SPIRType::Sampler);
					resources_in_set[desc_set].push_back(
					    { &var, descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler, sampler_resource_index, 0 });
				}
			}
			else if (inline_uniform_blocks.count(SetBindingPair{ desc_set, binding }))
			{
				inline_block_vars.push_back(var_id);
			}
			else if (!constexpr_sampler && is_supported_argument_buffer_type(type))
			{
				// constexpr samplers are not declared as resources.
				// Inline uniform blocks are always emitted at the end.
				add_resource_name(var_id);

				uint32_t resource_index = ~0u;
				if (!descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				resources_in_set[desc_set].push_back(
					{ &var, descriptor_alias, to_name(var_id), type.basetype, resource_index, 0 });

				// Emulate texture2D atomic operations
				if (atomic_image_vars.count(var.self))
				{
					uint32_t buffer_resource_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
					resources_in_set[desc_set].push_back(
						{ &var, descriptor_alias, to_name(var_id) + "_atomic", SPIRType::Struct, buffer_resource_index, 0 });
				}
			}

			// Check if this descriptor set needs a swizzle buffer.
			if (needs_swizzle_buffer_def && is_sampled_image_type(type))
				set_needs_swizzle_buffer[desc_set] = true;
			else if (buffer_requires_array_length(var_id))
			{
				set_needs_buffer_sizes[desc_set] = true;
				needs_buffer_sizes = true;
			}
		}
	});

	if (needs_swizzle_buffer_def || needs_buffer_sizes)
	{
		uint32_t uint_ptr_type_id = 0;

		// We might have to add a swizzle buffer resource to the set.
		for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
		{
			if (!set_needs_swizzle_buffer[desc_set] && !set_needs_buffer_sizes[desc_set])
				continue;

			if (uint_ptr_type_id == 0)
			{
				uint_ptr_type_id = ir.increase_bound_by(1);

				// Create a buffer to hold extra data, including the swizzle constants.
				SPIRType uint_type_pointer = get_uint_type();
				uint_type_pointer.pointer = true;
				uint_type_pointer.pointer_depth++;
				uint_type_pointer.parent_type = get_uint_type_id();
				uint_type_pointer.storage = StorageClassUniform;
				set<SPIRType>(uint_ptr_type_id, uint_type_pointer);
				set_decoration(uint_ptr_type_id, DecorationArrayStride, 4);
			}

			if (set_needs_swizzle_buffer[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvSwizzleConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kSwizzleBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, nullptr, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}

			if (set_needs_buffer_sizes[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvBufferSizeConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kBufferSizeBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, nullptr, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}
		}
	}

	// Now add inline uniform blocks.
	for (uint32_t var_id : inline_block_vars)
	{
		auto &var = get<SPIRVariable>(var_id);
		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		add_resource_name(var_id);
		resources_in_set[desc_set].push_back(
		    { &var, nullptr, to_name(var_id), SPIRType::Struct, get_metal_resource_index(var, SPIRType::Struct), 0 });
	}

	for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
	{
		auto &resources = resources_in_set[desc_set];
		if (resources.empty())
			continue;

		assert(descriptor_set_is_argument_buffer(desc_set));

		uint32_t next_id = ir.increase_bound_by(3);
		uint32_t type_id = next_id + 1;
		uint32_t ptr_type_id = next_id + 2;
		argument_buffer_ids[desc_set] = next_id;

		auto &buffer_type = set<SPIRType>(type_id);

		buffer_type.basetype = SPIRType::Struct;

		if ((argument_buffer_device_storage_mask & (1u << desc_set)) != 0)
		{
			buffer_type.storage = StorageClassStorageBuffer;
			// Make sure the argument buffer gets marked as const device.
			set_decoration(next_id, DecorationNonWritable);
			// Need to mark the type as a Block to enable this.
			set_decoration(type_id, DecorationBlock);
		}
		else
			buffer_type.storage = StorageClassUniform;

		set_name(type_id, join("spvDescriptorSetBuffer", desc_set));

		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = buffer_type;
		ptr_type.pointer = true;
		ptr_type.pointer_depth++;
		ptr_type.parent_type = type_id;

		uint32_t buffer_variable_id = next_id;
		set<SPIRVariable>(buffer_variable_id, ptr_type_id, StorageClassUniform);
		set_name(buffer_variable_id, join("spvDescriptorSet", desc_set));

		// Ids must be emitted in ID order.
		stable_sort(begin(resources), end(resources), [&](const Resource &lhs, const Resource &rhs) -> bool {
			return tie(lhs.index, lhs.basetype) < tie(rhs.index, rhs.basetype);
		});

		uint32_t member_index = 0;
		uint32_t next_arg_buff_index = 0;
		for (auto &resource : resources)
		{
			auto &var = *resource.var;
			auto &type = get_variable_data_type(var);

			// If needed, synthesize and add padding members.
			// member_index and next_arg_buff_index are incremented when padding members are added.
			if (msl_options.pad_argument_buffer_resources)
			{
				if (!resource.descriptor_alias)
				{
					while (resource.index > next_arg_buff_index)
					{
						auto &rez_bind = get_argument_buffer_resource(desc_set, next_arg_buff_index);
						switch (rez_bind.basetype)
						{
						case SPIRType::Void:
						case SPIRType::Boolean:
						case SPIRType::SByte:
						case SPIRType::UByte:
						case SPIRType::Short:
						case SPIRType::UShort:
						case SPIRType::Int:
						case SPIRType::UInt:
						case SPIRType::Int64:
						case SPIRType::UInt64:
						case SPIRType::AtomicCounter:
						case SPIRType::Half:
						case SPIRType::Float:
						case SPIRType::Double:
							add_argument_buffer_padding_buffer_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::Image:
							add_argument_buffer_padding_image_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::Sampler:
							add_argument_buffer_padding_sampler_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::SampledImage:
							if (next_arg_buff_index == rez_bind.msl_sampler)
								add_argument_buffer_padding_sampler_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							else
								add_argument_buffer_padding_image_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						default:
							break;
						}
					}
				}

				// Adjust the number of slots consumed by current member itself.
				// If actual member is an array, allow runtime array resolution as well.
				uint32_t elem_cnt = type.array.empty() ? 1 : to_array_size_literal(type);
				if (elem_cnt == 0)
					elem_cnt = get_resource_array_size(var.self);

				next_arg_buff_index += elem_cnt;
			}

			string mbr_name = ensure_valid_name(resource.name, "m");
			if (resource.plane > 0)
				mbr_name += join(plane_name_suffix, resource.plane);
			set_member_name(buffer_type.self, member_index, mbr_name);

			if (resource.basetype == SPIRType::Sampler && type.basetype != SPIRType::Sampler)
			{
				// Have to synthesize a sampler type here.

				bool type_is_array = !type.array.empty();
				uint32_t sampler_type_id = ir.increase_bound_by(type_is_array ? 2 : 1);
				auto &new_sampler_type = set<SPIRType>(sampler_type_id);
				new_sampler_type.basetype = SPIRType::Sampler;
				new_sampler_type.storage = StorageClassUniformConstant;

				if (type_is_array)
				{
					uint32_t sampler_type_array_id = sampler_type_id + 1;
					auto &sampler_type_array = set<SPIRType>(sampler_type_array_id);
					sampler_type_array = new_sampler_type;
					sampler_type_array.array = type.array;
					sampler_type_array.array_size_literal = type.array_size_literal;
					sampler_type_array.parent_type = sampler_type_id;
					buffer_type.member_types.push_back(sampler_type_array_id);
				}
				else
					buffer_type.member_types.push_back(sampler_type_id);
			}
			else
			{
				uint32_t binding = get_decoration(var.self, DecorationBinding);
				SetBindingPair pair = { desc_set, binding };

				if (resource.basetype == SPIRType::Image || resource.basetype == SPIRType::Sampler ||
				    resource.basetype == SPIRType::SampledImage)
				{
					// Drop pointer information when we emit the resources into a struct.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					if (resource.plane == 0)
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (buffers_requiring_dynamic_offset.count(pair))
				{
					if (resource.descriptor_alias)
						SPIRV_CROSS_THROW("Descriptor aliasing is currently not supported with dynamic offsets.");

					// Don't set the qualified name here; we'll define a variable holding the corrected buffer address later.
					buffer_type.member_types.push_back(var.basetype);
					buffers_requiring_dynamic_offset[pair].second = var.self;
				}
				else if (inline_uniform_blocks.count(pair))
				{
					if (resource.descriptor_alias)
						SPIRV_CROSS_THROW("Descriptor aliasing is currently not supported with inline UBOs.");

					// Put the buffer block itself into the argument buffer.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (atomic_image_vars.count(var.self))
				{
					// Emulate texture2D atomic operations.
					// Don't set the qualified name: it's already set for this variable,
					// and the code that references the buffer manually appends "_atomic"
					// to the name.
					uint32_t offset = ir.increase_bound_by(2);
					uint32_t atomic_type_id = offset;
					uint32_t type_ptr_id = offset + 1;

					SPIRType atomic_type;
					atomic_type.basetype = SPIRType::AtomicCounter;
					atomic_type.width = 32;
					atomic_type.vecsize = 1;
					set<SPIRType>(atomic_type_id, atomic_type);

					atomic_type.pointer = true;
					atomic_type.pointer_depth++;
					atomic_type.parent_type = atomic_type_id;
					atomic_type.storage = StorageClassStorageBuffer;
					auto &atomic_ptr_type = set<SPIRType>(type_ptr_id, atomic_type);
					atomic_ptr_type.self = atomic_type_id;

					buffer_type.member_types.push_back(type_ptr_id);
				}
				else
				{
					if (!resource.descriptor_alias || resource.descriptor_alias == resource.var)
						buffer_type.member_types.push_back(var.basetype);

					if (resource.descriptor_alias && resource.descriptor_alias != resource.var)
						buffer_aliases_argument.push_back({ var.self, resource.descriptor_alias->self });
					else if (type.array.empty())
						set_qualified_name(var.self, join("(*", to_name(buffer_variable_id), ".", mbr_name, ")"));
					else
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
			}

			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationResourceIndexPrimary,
			                               resource.index);
			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationInterfaceOrigID,
			                               var.self);
			member_index++;
		}
	}
}